

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void do_objs(char *outfile)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  char local_31;
  int local_30;
  boolean sumerr;
  int iStack_2c;
  char class;
  int prefix;
  int nspell;
  char *objnam;
  char *c;
  int sum;
  int i;
  char *outfile_local;
  
  c._0_4_ = 0;
  iStack_2c = 0;
  local_31 = '\0';
  bVar1 = false;
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp == (FILE *)0x0) {
    perror(outfile);
    exit(1);
  }
  fprintf((FILE *)ofp,"%s",Dont_Edit_Code);
  fprintf((FILE *)ofp,"#ifndef ONAMES_H\n#define ONAMES_H\n\n");
  c._4_4_ = 0;
  while( true ) {
    local_30 = 0;
    bVar5 = true;
    if (c._4_4_ != 0) {
      bVar5 = objects[(int)c._4_4_].oc_class != '\x01';
    }
    if (!bVar5) break;
    objects[(int)c._4_4_].oc_descr_idx = (short)c._4_4_;
    objects[(int)c._4_4_].oc_name_idx = (short)c._4_4_;
    pcVar4 = tmpdup(obj_descr[objects[(int)c._4_4_].oc_name_idx].oc_name);
    if (pcVar4 != (char *)0x0) {
      objnam = pcVar4;
      if (objects[(int)c._4_4_].oc_class != local_31) {
        if (((uint)c != 0) && ((uint)c != 1000)) {
          fprintf(_stderr,"prob error for class %d (%d%%)",(ulong)(uint)(int)local_31,(ulong)(uint)c
                 );
          fflush(_stderr);
          bVar1 = true;
        }
        local_31 = objects[(int)c._4_4_].oc_class;
        c._0_4_ = 0;
      }
      for (; *objnam != '\0'; objnam = objnam + 1) {
        if ((*objnam < 'a') || ('z' < *objnam)) {
          if ((*objnam < 'A') || ('Z' < *objnam)) {
            *objnam = '_';
          }
        }
        else {
          *objnam = *objnam + -0x20;
        }
      }
      switch(local_31) {
      case '\x04':
        fprintf((FILE *)ofp,"#define\tRIN_");
        local_30 = 1;
        break;
      case '\x05':
        fprintf((FILE *)ofp,"#define\t");
        if ((*(ushort *)&objects[(int)c._4_4_].field_0x11 >> 4 & 0x1f) == 0x12) {
          fprintf((FILE *)ofp,"FAKE_AMULET_OF_YENDOR\t%d\n",(ulong)c._4_4_);
          local_30 = -1;
        }
        break;
      default:
        fprintf((FILE *)ofp,"#define\t");
        break;
      case '\b':
        fprintf((FILE *)ofp,"#define\tPOT_");
        local_30 = 1;
        break;
      case '\t':
        fprintf((FILE *)ofp,"#define\tSCR_");
        local_30 = 1;
        break;
      case '\n':
        fprintf((FILE *)ofp,"#define\tSPE_");
        local_30 = 1;
        iStack_2c = iStack_2c + 1;
        break;
      case '\v':
        fprintf((FILE *)ofp,"#define\tWAN_");
        local_30 = 1;
      }
      pFVar2 = ofp;
      if (-1 < local_30) {
        pcVar4 = limit(pcVar4,local_30);
        fprintf((FILE *)pFVar2,"%s\t%d\n",pcVar4,(ulong)c._4_4_);
      }
      c._0_4_ = (int)objects[(int)c._4_4_].oc_prob + (uint)c;
    }
    c._4_4_ = c._4_4_ + 1;
  }
  if (((uint)c != 0) && ((uint)c != 1000)) {
    fprintf(_stderr,"prob error for class %d (%d%%)",(ulong)(uint)(int)local_31,(ulong)(uint)c);
    fflush(_stderr);
    bVar1 = true;
  }
  fprintf((FILE *)ofp,"#define\tLAST_GEM\t(JADE)\n");
  fprintf((FILE *)ofp,"#define\tMAXSPELL\t%d\n",(ulong)(iStack_2c + 1));
  fprintf((FILE *)ofp,"#define\tNUM_OBJECTS\t%d\n",(ulong)c._4_4_);
  fprintf((FILE *)ofp,"\n/* Artifacts (unique objects) */\n\n");
  for (c._4_4_ = 1; artifact_names[(int)c._4_4_] != (char *)0x0; c._4_4_ = c._4_4_ + 1) {
    _prefix = tmpdup(artifact_names[(int)c._4_4_]);
    for (objnam = _prefix; *objnam != '\0'; objnam = objnam + 1) {
      if ((*objnam < 'a') || ('z' < *objnam)) {
        if ((*objnam < 'A') || ('Z' < *objnam)) {
          *objnam = '_';
        }
      }
      else {
        *objnam = *objnam + -0x20;
      }
    }
    iVar3 = strncmp(_prefix,"THE_",4);
    if (iVar3 == 0) {
      _prefix = _prefix + 4;
    }
    iVar3 = strncmp(_prefix,"PLATINUM_",9);
    pFVar2 = ofp;
    if (iVar3 == 0) {
      _prefix = _prefix + 9;
    }
    pcVar4 = limit(_prefix,1);
    fprintf((FILE *)pFVar2,"#define\tART_%s\t%d\n",pcVar4,(ulong)c._4_4_);
  }
  fprintf((FILE *)ofp,"#define\tNROFARTIFACTS\t%d\n",(ulong)(c._4_4_ - 1));
  fprintf((FILE *)ofp,"\n#endif /* ONAMES_H */\n");
  fclose((FILE *)ofp);
  if (bVar1) {
    exit(1);
  }
  return;
}

Assistant:

void do_objs(const char *outfile)
{
	int i, sum = 0;
	char *c, *objnam;
	int nspell = 0;
	int prefix = 0;
	char class = '\0';
	boolean	sumerr = FALSE;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp,"%s",Dont_Edit_Code);
	fprintf(ofp,"#ifndef ONAMES_H\n#define ONAMES_H\n\n");

	for (i = 0; !i || objects[i].oc_class != ILLOBJ_CLASS; i++) {
		objects[i].oc_name_idx = objects[i].oc_descr_idx = i;	/* init */
		if (!(objnam = tmpdup(OBJ_NAME(objects[i])))) continue;

		/* make sure probabilities add up to 1000 */
		if (objects[i].oc_class != class) {
			if (sum && sum != 1000) {
			    fprintf(stderr, "prob error for class %d (%d%%)",
				    class, sum);
			    fflush(stderr);
			    sumerr = TRUE;
			}
			class = objects[i].oc_class;
			sum = 0;
		}

		for (c = objnam; *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';

		switch (class) {
		    case WAND_CLASS:
			fprintf(ofp,"#define\tWAN_"); prefix = 1; break;
		    case RING_CLASS:
			fprintf(ofp,"#define\tRIN_"); prefix = 1; break;
		    case POTION_CLASS:
			fprintf(ofp,"#define\tPOT_"); prefix = 1; break;
		    case SPBOOK_CLASS:
			fprintf(ofp,"#define\tSPE_"); prefix = 1; nspell++; break;
		    case SCROLL_CLASS:
			fprintf(ofp,"#define\tSCR_"); prefix = 1; break;
		    case AMULET_CLASS:
			/* avoid trouble with stupid C preprocessors */
			fprintf(ofp,"#define\t");
			if (objects[i].oc_material == PLASTIC) {
			    fprintf(ofp,"FAKE_AMULET_OF_YENDOR\t%d\n", i);
			    prefix = -1;
			    break;
			}
			break;
		    default:
			fprintf(ofp,"#define\t");
		}
		if (prefix >= 0)
			fprintf(ofp,"%s\t%d\n", limit(objnam, prefix), i);
		prefix = 0;

		sum += objects[i].oc_prob;
	}

	/* check last set of probabilities */
	if (sum && sum != 1000) {
	    fprintf(stderr, "prob error for class %d (%d%%)", class, sum);
	    fflush(stderr);
	    sumerr = TRUE;
	}

	fprintf(ofp,"#define\tLAST_GEM\t(JADE)\n");
	fprintf(ofp,"#define\tMAXSPELL\t%d\n", nspell+1);
	fprintf(ofp,"#define\tNUM_OBJECTS\t%d\n", i);

	fprintf(ofp, "\n/* Artifacts (unique objects) */\n\n");

	for (i = 1; artifact_names[i]; i++) {
		for (c = objnam = tmpdup(artifact_names[i]); *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';

		if (!strncmp(objnam, "THE_", 4))
			objnam += 4;
		/* fudge _platinum_ YENDORIAN EXPRESS CARD */
		if (!strncmp(objnam, "PLATINUM_", 9))
			objnam += 9;
		fprintf(ofp,"#define\tART_%s\t%d\n", limit(objnam, 1), i);
	}

	fprintf(ofp, "#define\tNROFARTIFACTS\t%d\n", i-1);
	fprintf(ofp,"\n#endif /* ONAMES_H */\n");
	fclose(ofp);
	if (sumerr) exit(EXIT_FAILURE);
	return;
}